

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

Abc_Obj_t * Abc_SclAddOneInv(Bus_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts,float Gain)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  SC_Cell *p_01;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int local_60;
  int local_5c;
  int iStop;
  int i;
  int Limit;
  float Load;
  float LoadNew;
  float LoadWireThis;
  float LoadWirePrev;
  float Target;
  Abc_Obj_t *pInv;
  Abc_Obj_t *pFanout;
  SC_Cell *pCellNew;
  float Gain_local;
  Vec_Ptr_t *vFanouts_local;
  Abc_Obj_t *pObj_local;
  Bus_Man_t *p_local;
  
  fVar6 = SC_CellPinCap(p->pInv,0);
  i = 0;
  iVar2 = p->pPars->nDegree;
  iVar1 = Vec_PtrSize(vFanouts);
  iVar2 = Abc_MinInt(iVar2,iVar1);
  Bus_SclCheckSortedFanout(vFanouts);
  local_60 = 0;
  do {
    if (iVar2 <= local_60) {
LAB_0053184b:
      if (p->pPars->fAddBufs == 0) {
        _LoadWirePrev = Abc_NtkCreateNodeInv(p->pNtk,(Abc_Obj_t *)0x0);
      }
      else {
        _LoadWirePrev = Abc_NtkCreateNodeBuf(p->pNtk,(Abc_Obj_t *)0x0);
      }
      uVar3 = Abc_ObjId(_LoadWirePrev);
      uVar4 = Vec_FltSize(p->vCins);
      if (uVar3 != uVar4) {
        __assert_fail("(int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                      ,0x170,
                      "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)");
      }
      Vec_FltPush(p->vCins,0.0);
      Vec_FltPush(p->vETimes,0.0);
      Vec_FltPush(p->vLoads,0.0);
      Vec_FltPush(p->vDepts,0.0);
      iVar2 = Abc_MaxInt(local_60,2);
      iVar1 = Vec_PtrSize(vFanouts);
      iVar2 = Abc_MinInt(iVar2,iVar1);
      for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,local_5c);
        Vec_PtrWriteEntry(vFanouts,local_5c,(void *)0x0);
        iVar1 = Abc_ObjFaninNum(pAVar5);
        if (iVar1 == 0) {
          Abc_ObjAddFanin(pAVar5,_LoadWirePrev);
        }
        else {
          Abc_ObjPatchFanin(pAVar5,pObj,_LoadWirePrev);
        }
      }
      p_01 = Abc_SclFindSmallestGate(p->pInv,(float)i / Gain);
      p_00 = p->pNtk->vGates;
      uVar3 = Abc_ObjId(_LoadWirePrev);
      Vec_IntSetEntry(p_00,uVar3,p_01->Id);
      Abc_NtkComputeNodeDeparture(_LoadWirePrev,(float)p->pPars->Slew);
      fVar6 = Abc_NtkComputeNodeLoad(p,_LoadWirePrev);
      if ((fVar6 - (float)i < 1.0) && ((float)i - fVar6 < 1.0)) {
        fVar6 = SC_CellPinCap(p_01,0);
        Bus_SclObjSetCin(_LoadWirePrev,fVar6);
        fVar6 = Abc_NtkComputeEdgeDept(_LoadWirePrev,0,(float)p->pPars->Slew);
        Bus_SclObjSetETime(_LoadWirePrev,fVar6);
        if ((p->pNtk->vPhases != (Vec_Int_t *)0x0) &&
           (iVar2 = Abc_SclIsInv(_LoadWirePrev), iVar2 != 0)) {
          Abc_NodeInvUpdateFanPolarity(_LoadWirePrev);
        }
        return _LoadWirePrev;
      }
      __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                    ,0x184,
                    "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)");
    }
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,local_60);
    fVar7 = Abc_SclFindWireLoad(p->vWireCaps,local_60);
    fVar8 = Abc_SclFindWireLoad(p->vWireCaps,local_60 + 1);
    fVar9 = Bus_SclObjCin(pAVar5);
    i = (int)((fVar9 - fVar7) + fVar8 + (float)i);
    if (fVar6 * Gain < (float)i) {
      local_60 = local_60 + 1;
      goto LAB_0053184b;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

Abc_Obj_t * Abc_SclAddOneInv( Bus_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts, float Gain )
{
    SC_Cell * pCellNew;
    Abc_Obj_t * pFanout, * pInv;
    float Target = SC_CellPinCap(p->pInv, 0) * Gain;
    float LoadWirePrev, LoadWireThis, LoadNew, Load = 0;
    int Limit = Abc_MinInt( p->pPars->nDegree, Vec_PtrSize(vFanouts) );
    int i, iStop;
    Bus_SclCheckSortedFanout( vFanouts );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, iStop, Limit )
    {
        LoadWirePrev = Abc_SclFindWireLoad( p->vWireCaps, iStop );
        LoadWireThis = Abc_SclFindWireLoad( p->vWireCaps, iStop+1 );
        Load += Bus_SclObjCin( pFanout ) - LoadWirePrev + LoadWireThis;
        if ( Load > Target )
        {
            iStop++;
            break;
        }
    }
    // create inverter
    if ( p->pPars->fAddBufs )
        pInv = Abc_NtkCreateNodeBuf( p->pNtk, NULL );
    else
        pInv = Abc_NtkCreateNodeInv( p->pNtk, NULL );
    assert( (int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins) );
    Vec_FltPush( p->vCins,   0 );
    Vec_FltPush( p->vETimes, 0 );
    Vec_FltPush( p->vLoads,  0 );
    Vec_FltPush( p->vDepts,  0 );
    Limit = Abc_MinInt( Abc_MaxInt(iStop, 2), Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Limit )
    {
        Vec_PtrWriteEntry( vFanouts, i, NULL );
        if ( Abc_ObjFaninNum(pFanout) == 0 )
            Abc_ObjAddFanin( pFanout, pInv );
        else
            Abc_ObjPatchFanin( pFanout, pObj, pInv );
    }
    // set the gate
    pCellNew = Abc_SclFindSmallestGate( p->pInv, Load / Gain );
    Vec_IntSetEntry( p->pNtk->vGates, Abc_ObjId(pInv), pCellNew->Id );
    // set departure and load
    Abc_NtkComputeNodeDeparture( pInv, p->pPars->Slew );
    LoadNew = Abc_NtkComputeNodeLoad( p, pInv );
    assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
    // set fanout info for the inverter
    Bus_SclObjSetCin( pInv, SC_CellPinCap(pCellNew, 0) );
    Bus_SclObjSetETime( pInv, Abc_NtkComputeEdgeDept(pInv, 0, p->pPars->Slew) );
    // update phases
    if ( p->pNtk->vPhases && Abc_SclIsInv(pInv) )
        Abc_NodeInvUpdateFanPolarity( pInv );
    return pInv;
}